

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::asString
          (lang *this,unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *expr)

{
  int iVar1;
  Opcode opc;
  undefined8 local_20;
  
  iVar1 = (**(code **)((long)(((expr->_M_t).
                               super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                               .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl)->
                             super_ASTNode)._vptr_ASTNode + 0x18))();
  if (iVar1 == 3) {
    *(Expr **)this =
         (expr->_M_t).
         super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
         super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
         super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
    (expr->_M_t).super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
    _M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
    super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  }
  else {
    opc = makeOperator(StringType,
                       (expr->_M_t).
                       super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                       .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl);
    if (opc == EXIT) {
      local_20 = 0;
    }
    else {
      std::
      make_unique<flow::lang::UnaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                ((Opcode *)&local_20,
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&opc,
                 (SourceLocation *)expr);
    }
    *(undefined8 *)this = local_20;
  }
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> asString(std::unique_ptr<Expr>&& expr) {
  LiteralType baseType = expr->getType();
  if (baseType == LiteralType::String) return std::move(expr);

  Opcode opc = makeOperator(Token::StringType, expr.get());
  if (opc == Opcode::EXIT) return nullptr;  // cast error

  return std::make_unique<UnaryExpr>(opc, std::move(expr), expr->location());
}